

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_params.cpp
# Opt level: O3

vector<char,_std::allocator<char>_> *
libtorrent::write_session_params_buf
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,session_params *sp,
          save_state_flags_t flags)

{
  entry e;
  bencode_visitor<std::back_insert_iterator<std::vector<char,_std::allocator<char>_>_>_> local_48;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> local_40;
  variant<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
  local_38;
  
  write_session_params((entry *)&local_38,sp,flags);
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.out = &local_40;
  local_40.container = __return_storage_ptr__;
  ::std::
  visit<libtorrent::aux::bencode_visitor<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>,std::variant<long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>const&>
            (&local_48,&local_38);
  entry::~entry((entry *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> write_session_params_buf(session_params const& sp, save_state_flags_t const flags)
{
	auto const e = write_session_params(sp, flags);
	std::vector<char> ret;
	bencode(std::back_inserter(ret), e);
	return ret;
}